

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_save_simple_key(yaml_parser_t *parser)

{
  size_t sVar1;
  yaml_token_t *pyVar2;
  yaml_token_t *pyVar3;
  size_t sVar4;
  yaml_simple_key_t *pyVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  if (parser->flow_level == 0) {
    bVar10 = (parser->mark).column == (long)parser->indent;
  }
  else {
    bVar10 = false;
  }
  if ((parser->simple_key_allowed == 0 & bVar10) != 1) {
    iVar9 = 1;
    if (parser->simple_key_allowed != 0) {
      sVar1 = parser->tokens_parsed;
      pyVar2 = (parser->tokens).tail;
      pyVar3 = (parser->tokens).head;
      sVar4 = (parser->mark).column;
      sVar6 = (parser->mark).index;
      sVar7 = (parser->mark).line;
      iVar8 = yaml_parser_remove_simple_key(parser);
      if (iVar8 == 0) {
        iVar9 = 0;
      }
      else {
        pyVar5 = (parser->simple_keys).top;
        pyVar5[-1].possible = 1;
        pyVar5[-1].required = (uint)bVar10;
        pyVar5[-1].token_number = ((long)pyVar2 - (long)pyVar3) / 0x50 + sVar1;
        pyVar5[-1].mark.index = sVar6;
        pyVar5[-1].mark.line = sVar7;
        pyVar5[-1].mark.column = sVar4;
      }
    }
    return iVar9;
  }
  __assert_fail("parser->simple_key_allowed || !required",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yaml/src/scanner.c"
                ,0x459,"int yaml_parser_save_simple_key(yaml_parser_t *)");
}

Assistant:

static int
yaml_parser_save_simple_key(yaml_parser_t *parser)
{
    /*
     * A simple key is required at the current position if the scanner is in
     * the block context and the current column coincides with the indentation
     * level.
     */

    int required = (!parser->flow_level
            && parser->indent == (ptrdiff_t)parser->mark.column);

    /*
     * A simple key is required only when it is the first token in the current
     * line.  Therefore it is always allowed.  But we add a check anyway.
     */

    assert(parser->simple_key_allowed || !required);    /* Impossible. */

    /*
     * If the current position may start a simple key, save it.
     */

    if (parser->simple_key_allowed)
    {
        yaml_simple_key_t simple_key;
        simple_key.possible = 1;
        simple_key.required = required;
        simple_key.token_number = 
            parser->tokens_parsed + (parser->tokens.tail - parser->tokens.head);
        simple_key.mark = parser->mark;

        if (!yaml_parser_remove_simple_key(parser)) return 0;

        *(parser->simple_keys.top-1) = simple_key;
    }

    return 1;
}